

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHtmlElement.cpp
# Opt level: O2

void __thiscall KDReports::HtmlElement::HtmlElement(HtmlElement *this,HtmlElement *other)

{
  HtmlElementPrivate *this_00;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__HtmlElement_00170208;
  this_00 = (HtmlElementPrivate *)operator_new(0x30);
  HtmlElementPrivate::HtmlElementPrivate
            (this_00,(other->d)._M_t.
                     super___uniq_ptr_impl<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_KDReports::HtmlElementPrivate_*,_std::default_delete<KDReports::HtmlElementPrivate>_>
                     .super__Head_base<0UL,_KDReports::HtmlElementPrivate_*,_false>._M_head_impl);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::HtmlElementPrivate,_std::default_delete<KDReports::HtmlElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::HtmlElementPrivate_*,_std::default_delete<KDReports::HtmlElementPrivate>_>
  .super__Head_base<0UL,_KDReports::HtmlElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::HtmlElement::HtmlElement(const HtmlElement &other)
    : Element(other)
    , d(new HtmlElementPrivate(*other.d))
{
}